

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.cc
# Opt level: O1

uint __thiscall
cnn::ClassFactoredSoftmaxBuilder::sample(ClassFactoredSoftmaxBuilder *this,Expression *rep)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  Tensor *pTVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  float fVar9;
  vector<float,_std::allocator<float>_> wdist;
  vector<float,_std::allocator<float>_> cdist;
  Expression wscores;
  Expression cscores;
  undefined1 local_a8 [48];
  vector<float,_std::allocator<float>_> local_78;
  Expression local_60;
  initializer_list<cnn::expr::Expression> local_50;
  Expression local_40;
  
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_a8;
  local_a8._0_8_ = (this->cbias).pg;
  local_a8._8_4_ = (this->cbias).i.t;
  local_a8._16_8_ = (this->r2c).pg;
  local_a8._24_4_ = (this->r2c).i.t;
  local_a8._32_8_ = rep->pg;
  local_a8._40_4_ = (rep->i).t;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3;
  expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
            ((detail *)&local_40,(initializer_list<cnn::expr::Expression> *)&local_78);
  expr::softmax((expr *)local_a8,&local_40);
  pTVar4 = ComputationGraph::incremental_forward(this->pcg);
  as_vector(&local_78,pTVar4);
  fVar9 = rand01();
  uVar5 = (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar8 = 0;
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar8 = (uint)uVar6;
      fVar9 = fVar9 - *(float *)((long)(_func_int ***)
                                       local_78.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start + uVar6 * 4);
      if (fVar9 < 0.0) break;
      uVar8 = uVar8 + 1;
      uVar6 = (ulong)uVar8;
    } while (uVar6 < uVar5);
  }
  uVar8 = uVar8 - (uVar5 == uVar6);
  uVar5 = (ulong)uVar8;
  if (((this->singleton_cluster).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar8 >> 6] >> (uVar5 & 0x3f)
      & 1) == 0) {
    pEVar2 = (this->rc2biases).
             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar1 = pEVar2 + uVar5;
    if (pEVar2[uVar5].pg == (ComputationGraph *)0x0) {
      expr::parameter((ComputationGraph *)local_a8,(Parameters *)this->pcg);
      pEVar1->pg = (ComputationGraph *)local_a8._0_8_;
      (pEVar1->i).t = local_a8._8_4_;
    }
    pEVar3 = (this->rc2ws).
             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar2 = pEVar3 + uVar5;
    if (pEVar3[uVar5].pg == (ComputationGraph *)0x0) {
      expr::parameter((ComputationGraph *)local_a8,(Parameters *)this->pcg);
      pEVar2->pg = (ComputationGraph *)local_a8._0_8_;
      (pEVar2->i).t = local_a8._8_4_;
    }
    local_a8._0_8_ = pEVar1->pg;
    local_a8._8_4_ = (pEVar1->i).t;
    local_a8._16_8_ = pEVar2->pg;
    local_a8._24_4_ = (pEVar2->i).t;
    local_a8._32_8_ = rep->pg;
    local_a8._40_4_ = (rep->i).t;
    local_50._M_len = 3;
    local_50._M_array = (iterator)local_a8;
    expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&local_60,&local_50);
    expr::softmax((expr *)local_a8,&local_60);
    pTVar4 = ComputationGraph::incremental_forward(this->pcg);
    as_vector((vector<float,_std::allocator<float>_> *)local_a8,pTVar4);
    fVar9 = rand01();
    uVar6 = (long)CONCAT44(local_a8._12_4_,local_a8._8_4_) - local_a8._0_8_ >> 2;
    if ((ComputationGraph *)CONCAT44(local_a8._12_4_,local_a8._8_4_) ==
        (ComputationGraph *)local_a8._0_8_) {
      uVar8 = 0;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        uVar8 = (uint)uVar7;
        fVar9 = fVar9 - *(float *)((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                                           local_a8._0_8_)->
                                          super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar7 * 4);
        if (fVar9 < 0.0) break;
        uVar8 = uVar8 + 1;
        uVar7 = (ulong)uVar8;
      } while (uVar7 < uVar6);
    }
    if ((ComputationGraph *)local_a8._0_8_ != (ComputationGraph *)0x0) {
      operator_delete((void *)local_a8._0_8_);
    }
    uVar6 = (ulong)(uVar8 - (uVar6 == uVar7));
  }
  else {
    uVar6 = 0;
  }
  uVar8 = *(uint *)(*(long *)&(this->cidx2words).
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar5].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + uVar6 * 4);
  if ((ExecutionEngine *)
      local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (ExecutionEngine *)0x0) {
    operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return uVar8;
}

Assistant:

unsigned ClassFactoredSoftmaxBuilder::sample(const expr::Expression& rep) {
  // TODO assert that new_graph has been called
  Expression cscores = affine_transform({cbias, r2c, rep});
  softmax(cscores);
  auto cdist = as_vector(pcg->incremental_forward());
  unsigned c = 0;
  double p = rand01();
  for (; c < cdist.size(); ++c) {
    p -= cdist[c];
    if (p < 0.0) { break; }
  }
  if (c == cdist.size()) --c;
  unsigned w = 0;
  if (!singleton_cluster[c]) {
    Expression& cwbias = get_rc2wbias(c);
    Expression& r2cw = get_rc2w(c);
    Expression wscores = affine_transform({cwbias, r2cw, rep});
    softmax(wscores);
    auto wdist = as_vector(pcg->incremental_forward());
    p = rand01();
    for (; w < wdist.size(); ++w) {
      p -= wdist[w];
      if (p < 0.0) { break; }
    }
    if (w == wdist.size()) --w;
  }
  return cidx2words[c][w];
}